

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Key.hpp
# Opt level: O2

Key<4UL> supermap::Key<4UL>::fromString(string *strKey)

{
  pointer pcVar1;
  IllegalArgumentException *this;
  size_t i;
  long lVar2;
  Key<4UL> arrKey;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (strKey->_M_string_length == 4) {
    pcVar1 = (strKey->_M_dataplus)._M_p;
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      arrKey.super_array<unsigned_char,_4UL>._M_elems[lVar2] = pcVar1[lVar2];
    }
    return (Key<4UL>)arrKey.super_array<unsigned_char,_4UL>;
  }
  this = (IllegalArgumentException *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_58,4);
  std::operator+(&local_38,
                 "String key length can not be different to template size parameter, expected: ",
                 &local_58);
  supermap::IllegalArgumentException::IllegalArgumentException(this,(string *)&local_38);
  __cxa_throw(this,&IllegalArgumentException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static Key<Len> fromString(const std::string &strKey) {
        if (strKey.length() != Len) {
            throw IllegalArgumentException(
                "String key length can not be different to template size parameter, expected: " + std::to_string(Len));
        }

        Key<Len> arrKey;
        for (std::size_t i = 0; i < strKey.length(); ++i) {
            arrKey[i] = strKey[i];
        }

        return arrKey;
    }